

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8SourceInfo.h
# Opt level: O1

void __thiscall Js::Utf8SourceInfo::SetInDebugMode(Utf8SourceInfo *this,bool inDebugMode)

{
  ISourceHolder *pIVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  if ((this->field_0xa8 & 4) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                ,0x39,"(!GetIsLibraryCode())",
                                "Shouldn\'t call SetInDebugMode for Library code.");
    if (!bVar3) goto LAB_0079d9b5;
    *puVar5 = 0;
  }
  if ((this->sourceHolder).ptr == (ISourceHolder *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                ,0x3b,"(this->sourceHolder != nullptr)","We have no source holder.")
    ;
    if (!bVar3) goto LAB_0079d9b5;
    *puVar5 = 0;
  }
  if (((this->field_0xa8 & 0x40) == 0) != inDebugMode) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                ,0x3d,"(this->m_isInDebugMode != inDebugMode)",
                                "Why are we setting same value");
    if (!bVar3) {
LAB_0079d9b5:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  this->field_0xa8 = this->field_0xa8 & 0xbf | inDebugMode << 6;
  iVar4 = (*(((this->sourceHolder).ptr)->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0xb])();
  if ((char)iVar4 != '\0') {
    if (inDebugMode) {
      pIVar1 = (this->sourceHolder).ptr;
      iVar4 = (*(pIVar1->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[6])(pIVar1,L"Entering Debug Mode");
      Memory::Recycler::WBSetBit((char *)&this->debugModeSource);
      (this->debugModeSource).ptr = (uchar *)CONCAT44(extraout_var,iVar4);
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->debugModeSource);
      pIVar1 = (this->sourceHolder).ptr;
      iVar4 = (*(pIVar1->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[7])(pIVar1,L"Entering Debug Mode");
      this->debugModeSourceLength = CONCAT44(extraout_var_00,iVar4);
      iVar4 = (*(((this->sourceHolder).ptr)->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[10])();
      this->field_0xa8 =
           this->field_0xa8 & 0xdf |
           ((this->debugModeSource).ptr == (uchar *)0x0 | (byte)iVar4) << 5;
      EnsureLineOffsetCache(this);
      return;
    }
    this->field_0xa8 = this->field_0xa8 & 0xdf;
    (this->debugModeSource).ptr = (uchar *)0x0;
    this->debugModeSourceLength = 0;
  }
  return;
}

Assistant:

void SetInDebugMode(bool inDebugMode)
        {
            AssertMsg(!GetIsLibraryCode(), "Shouldn't call SetInDebugMode for Library code.");

            AssertMsg(this->sourceHolder != nullptr, "We have no source holder.");

            AssertMsg(this->m_isInDebugMode != inDebugMode, "Why are we setting same value");

            this->m_isInDebugMode = inDebugMode;

            if (!this->sourceHolder->IsDeferrable())
            {
                return;
            }

            if (inDebugMode)
            {
                this->debugModeSource = this->sourceHolder->GetSource(_u("Entering Debug Mode"));
                this->debugModeSourceLength = this->sourceHolder->GetByteLength(_u("Entering Debug Mode"));
                this->debugModeSourceIsEmpty = !this->HasSource() || this->debugModeSource == nullptr;
                this->EnsureLineOffsetCache();
            }
            else
            {
                // If debugModeSourceIsEmpty is false, that means debugModeSource isn't nullptr or we aren't in debug mode.
                this->debugModeSourceIsEmpty = false;
                this->debugModeSource = nullptr;
                this->debugModeSourceLength = 0;
            }
        }